

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int stbtt_IsGlyphEmpty(stbtt_fontinfo *info,int glyph_index)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  if ((info->cff).size == 0) {
    uVar2 = stbtt__GetGlyfOffset(info,glyph_index);
    if ((int)uVar2 < 0) {
      bVar3 = true;
    }
    else {
      bVar3 = info->data[(ulong)uVar2 + 1] == '\0' && info->data[uVar2] == '\0';
    }
  }
  else {
    iVar1 = stbtt__GetGlyphInfoT2(info,glyph_index,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0);
    bVar3 = iVar1 == 0;
  }
  return (int)bVar3;
}

Assistant:

STBTT_DEF int stbtt_IsGlyphEmpty(const stbtt_fontinfo *info, int glyph_index)
{
stbtt_int16 numberOfContours;
int g;
if (info->cff.size)
return stbtt__GetGlyphInfoT2(info, glyph_index, NULL, NULL, NULL, NULL) == 0;
g = stbtt__GetGlyfOffset(info, glyph_index);
if (g < 0) return 1;
numberOfContours = ttSHORT(info->data + g);
return numberOfContours == 0;
}